

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O2

void __thiscall
LINAnalyzerResults::GenerateFrameTabularText
          (LINAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  bool bVar1;
  string *psVar2;
  string str;
  string fault_str;
  Frame frame;
  ulonglong local_140;
  long local_138;
  undefined1 local_130;
  byte local_12f;
  char seq_str [128];
  char number_str [128];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  fault_str._M_dataplus._M_p = (pointer)&fault_str.field_2;
  fault_str._M_string_length = 0;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  fault_str.field_2._M_local_buf[0] = '\0';
  str.field_2._M_local_buf[0] = '\0';
  if ((local_12f & 1) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_12f & 2) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_12f & 4) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_12f & 8) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if (fault_str._M_string_length != 0) {
    psVar2 = &fault_str;
    std::__cxx11::string::append((char *)psVar2);
    goto LAB_00109ca9;
  }
  AnalyzerHelpers::GetNumberString(local_140,display_base,8,number_str,0x80);
  switch(local_130) {
  case 1:
    break;
  case 2:
    break;
  case 3:
    AnalyzerHelpers::GetNumberString((ulong)((uint)local_140 & 0x3f),display_base,8,number_str,0x80)
    ;
  case 6:
switchD_00109bd1_caseD_6:
    std::__cxx11::string::append((char *)&str);
    break;
  case 4:
  case 5:
    AnalyzerHelpers::GetNumberString(local_138 - 1,Decimal,8,seq_str,0x80);
    std::__cxx11::string::append((char *)&str);
    std::__cxx11::string::append((char *)&str);
    std::__cxx11::string::append((char *)&str);
    psVar2 = &str;
    std::__cxx11::string::append((char *)psVar2);
    goto LAB_00109ca9;
  case 7:
    bVar1 = IsFrameChecksum(this,frame_index);
    if (!bVar1) {
      AnalyzerHelpers::GetNumberString(local_138 - 1,Decimal,8,seq_str,0x80);
      std::__cxx11::string::append((char *)&str);
      std::__cxx11::string::append((char *)&str);
      std::__cxx11::string::append((char *)&str);
      psVar2 = &str;
      std::__cxx11::string::append((char *)psVar2);
      goto LAB_00109ca9;
    }
    goto switchD_00109bd1_caseD_6;
  }
  psVar2 = &str;
  std::__cxx11::string::append((char *)psVar2);
LAB_00109ca9:
  AnalyzerResults::AddTabularText
            ((char *)this,(psVar2->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
            );
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&fault_str);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str;

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddTabularText( fault_str.c_str() );
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:

            str += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;

        case LINAnalyzerResults::headerBreak: // expecting break.

            str += "Header Break";
            break;

        case LINAnalyzerResults::headerSync: // expecting sync.

            str += "Header Sync";
            break;

        case LINAnalyzerResults::headerPID: // expecting PID.

            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str += "Protected ID: ";
            str += number_str;
            break;

        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str += "Data ";
            str += seq_str;
            str += ": ";
            str += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str += "Checksum: ";
            str += number_str;
            break;
        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str += "Checksum: ";
                str += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str += "Data ";
                str += seq_str;
                str += ": ";
                str += number_str;
            }

            break;
        }

        AddTabularText( str.c_str() );
    }
}